

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::create_group_ops
          (ConvolutionDepthWise_x86_avx2 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  long *plVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int i;
  uint uVar11;
  pointer ppLVar12;
  _func_int *p_Var13;
  Layer *pLVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  pointer ppLVar18;
  long lVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 in_ZMM7 [64];
  ParamDict pd;
  Mat local_348;
  Allocator *local_2f8;
  int *local_2f0;
  size_t local_2e8;
  uint local_2e0;
  Allocator *local_2d8;
  undefined8 local_2d0;
  size_t sStack_2c8;
  uint local_2c0;
  size_t local_2b8;
  int local_2ac;
  void *local_2a8;
  int *piStack_2a0;
  size_t local_298;
  int local_290;
  Allocator *local_288;
  int local_280;
  int iStack_27c;
  undefined8 uStack_278;
  int local_270;
  size_t local_268;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_260;
  Allocator *local_258;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 local_248;
  undefined4 uStack_244;
  uint local_240;
  undefined1 auStack_23c [4];
  Allocator *local_238;
  uint uStack_230;
  int iStack_22c;
  uint uStack_228;
  uint uStack_224;
  uint uStack_220;
  undefined1 auStack_21c [4];
  size_t local_218;
  Mat local_208;
  Allocator *local_1c0;
  int *piStack_1b8;
  size_t local_1b0;
  uint local_1a8;
  Allocator *local_1a0;
  undefined8 local_198;
  size_t sStack_190;
  uint local_188;
  size_t local_180;
  Allocator *local_178;
  int *piStack_170;
  size_t local_168;
  uint local_160;
  Allocator *local_158;
  undefined8 local_150;
  size_t sStack_148;
  uint local_140;
  size_t local_138;
  Allocator *local_130;
  int *piStack_128;
  size_t sStack_120;
  uint uStack_118;
  Allocator *local_110;
  undefined8 local_108;
  size_t sStack_100;
  uint local_f8;
  size_t local_f0;
  Allocator *local_e8;
  int *piStack_e0;
  size_t sStack_d8;
  uint uStack_d0;
  Allocator *local_c8;
  undefined8 local_c0;
  size_t sStack_b8;
  uint local_b0;
  size_t local_a8;
  undefined1 local_98 [16];
  size_t local_88;
  undefined1 *local_80;
  size_t local_78;
  Option *local_70;
  ParamDict local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  ppLVar18 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  iVar17 = *(int *)(&this->field_0xd8 + (long)p_Var13) * *(int *)(&this->field_0xd4 + (long)p_Var13)
  ;
  iVar2 = *(int *)(&this->field_0xd0 + (long)p_Var13);
  iVar3 = *(int *)(&this->field_0x108 + (long)p_Var13);
  uVar16 = (long)*(int *)(&this->field_0x104 + (long)p_Var13) / (long)iVar3;
  uVar16 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) / (long)iVar17;
  ppLVar12 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_70 = opt;
  if (0 < (int)((ulong)((long)ppLVar12 - (long)ppLVar18) >> 3)) {
    lVar19 = 0;
    do {
      if (ppLVar18[lVar19] != (Layer *)0x0) {
        (*ppLVar18[lVar19]->_vptr_Layer[1])();
        ppLVar18 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar12 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < (int)((ulong)((long)ppLVar12 - (long)ppLVar18) >> 3));
  }
  local_260 = &this->group_ops;
  if (ppLVar12 != ppLVar18) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar18;
  }
  iVar4 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_260,(long)iVar4);
  if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])) {
    local_80 = &this->field_0x118;
    local_2ac = iVar17 * i *
                (((int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_78 = (size_t)local_2ac;
    local_88 = (size_t)i;
    p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
    local_98._8_4_ = 1;
    local_98._0_8_ = 0x100000001;
    local_98._12_4_ = 1;
    lVar19 = 0;
    local_58 = 0x8000000000000000;
    uStack_50 = 0x8000000000000000;
    uStack_48 = 0x8000000000000000;
    uStack_40 = 0x8000000000000000;
    do {
      local_298 = *(size_t *)(&this->field_0x178 + (long)p_Var13);
      local_2a8 = (void *)(lVar19 * local_78 * local_298 +
                          *(long *)(&this->field_0x168 + (long)p_Var13));
      local_290 = *(int *)(&this->field_0x180 + (long)p_Var13);
      local_288 = *(Allocator **)(&this->field_0x188 + (long)p_Var13);
      piStack_2a0 = (int *)0x0;
      local_280 = 1;
      iStack_27c = (int)local_78;
      uStack_278._0_4_ = 1;
      uStack_278._4_4_ = 1;
      local_270 = 1;
      local_268 = local_78;
      local_218 = 0;
      local_258 = (Allocator *)0x0;
      local_248 = 0;
      uStack_244 = 0;
      local_240 = 0;
      local_238 = (Allocator *)0x0;
      iStack_22c = 0;
      bVar20 = *(int *)(&this->field_0x100 + (long)p_Var13) != 0;
      if (bVar20) {
        local_238 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var13);
        local_240 = *(uint *)(&this->field_0x1c8 + (long)p_Var13);
        lVar15 = *(long *)(&this->field_0x1c0 + (long)p_Var13);
        local_258 = (Allocator *)
                    (lVar19 * local_88 * lVar15 + *(long *)(&this->field_0x1b0 + (long)p_Var13));
        local_248 = (undefined4)lVar15;
        uStack_244 = (undefined4)((ulong)lVar15 >> 0x20);
        local_218 = local_88;
        iStack_22c = i;
      }
      uStack_220 = (uint)bVar20;
      uStack_224 = (uint)bVar20;
      uStack_228 = (uint)bVar20;
      uStack_230 = (uint)bVar20;
      uStack_24c = 0;
      uStack_250 = 0;
      auVar30 = ZEXT1632(in_ZMM7._0_16_);
      pLVar14 = create_layer(6);
      ParamDict::ParamDict(&local_68);
      ParamDict::set(&local_68,0,i);
      ParamDict::set(&local_68,1,
                     *(int *)(&this->field_0xd4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,0xb,
                     *(int *)(&this->field_0xd8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,2,
                     *(int *)(&this->field_0xdc +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,0xc,
                     *(int *)(&this->field_0xe0 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,3,
                     *(int *)(&this->field_0xe4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,0xd,
                     *(int *)(&this->field_0xe8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,4,0);
      ParamDict::set(&local_68,0xe,0);
      ParamDict::set(&local_68,5,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,6,local_2ac);
      ParamDict::set(&local_68,8,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,9,
                     *(int *)(&this->field_0x110 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,10,
                     (Mat *)(local_80 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      (*pLVar14->_vptr_Layer[2])(pLVar14,&local_68);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) == 0) {
        lVar15 = 0x40;
        auVar22._0_12_ = ZEXT812(0);
        auVar22._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_208.data + lVar15) = 0;
          *(undefined1 (*) [16])((long)&local_248 + lVar15) = auVar22;
          *(undefined1 (*) [16])(auStack_23c + lVar15) = auVar22;
          *(undefined1 (*) [16])((long)&uStack_228 + lVar15) = auVar22;
          *(undefined1 (*) [16])(auStack_21c + lVar15) = auVar22;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x160);
        if (local_208.refcount != (int *)0x0) {
          LOCK();
          *local_208.refcount = *local_208.refcount + -1;
          UNLOCK();
          if (*local_208.refcount == 0) {
            if (local_208.allocator == (Allocator *)0x0) {
              if (local_208.data != (void *)0x0) {
                free(local_208.data);
              }
            }
            else {
              (*(local_208.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        auVar22 = auVar30._0_16_;
        local_208.data = local_2a8;
        local_208.refcount = piStack_2a0;
        local_208.elemsize = local_298;
        local_208.elempack = local_290;
        local_208.allocator = local_288;
        local_208.w = iStack_27c;
        local_208.dims = local_280;
        local_208.h = (int)uStack_278;
        local_208.d = uStack_278._4_4_;
        local_208.c = local_270;
        local_208.cstep = local_268;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) != 0)
        {
          local_348.cstep = 0;
          local_348.data = (Allocator *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize = 0;
          local_348.elempack = 0;
          local_348.allocator = (Allocator *)local_348.data;
          local_348.dims = (int)local_348.refcount;
          local_348.w = local_348.elempack;
          local_348._48_8_ = local_348.elemsize;
          local_348.c = local_348.elempack;
          Mat::create(&local_348,i,4,(Allocator *)0x0);
          uVar11 = local_348.c * (int)local_348.cstep;
          auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar28._8_8_ = uStack_50;
          auVar28._0_8_ = local_58;
          auVar28._16_8_ = uStack_48;
          auVar28._24_8_ = uStack_40;
          auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
          auVar22 = auVar30._0_16_;
          if (0 < (int)uVar11) {
            lVar15 = (ulong)uVar11 - 1;
            auVar26._8_8_ = lVar15;
            auVar26._0_8_ = lVar15;
            auVar26._16_8_ = lVar15;
            auVar26._24_8_ = lVar15;
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) + lVar19 * 4);
            auVar24._4_4_ = uVar1;
            auVar24._0_4_ = uVar1;
            auVar24._8_4_ = uVar1;
            auVar24._12_4_ = uVar1;
            auVar24._16_4_ = uVar1;
            auVar24._20_4_ = uVar1;
            auVar24._24_4_ = uVar1;
            auVar24._28_4_ = uVar1;
            uVar16 = 0;
            do {
              auVar29._8_8_ = uVar16;
              auVar29._0_8_ = uVar16;
              auVar29._16_8_ = uVar16;
              auVar29._24_8_ = uVar16;
              auVar10 = vpor_avx2(auVar29,auVar8);
              auVar29 = vpor_avx2(auVar29,auVar9);
              auVar29 = vpcmpgtq_avx2(auVar29 ^ auVar28,auVar26 ^ auVar28);
              auVar10 = vpcmpgtq_avx2(auVar10 ^ auVar28,auVar26 ^ auVar28);
              auVar29 = vpackssdw_avx2(auVar10,auVar29);
              auVar21 = vpackssdw_avx(SUB3216(auVar29 ^ auVar30,0),SUB3216(auVar29 ^ auVar30,0x10));
              auVar21 = vpshufd_avx(auVar21,0xd8);
              auVar29 = vpmovzxwd_avx2(auVar21);
              auVar29 = vpslld_avx2(auVar29,0x1f);
              auVar29 = vmaskmovps_avx(auVar29,auVar24);
              *(undefined1 (*) [32])((long)(_func_int ***)local_348.data + uVar16 * 4) = auVar29;
              uVar16 = uVar16 + 8;
            } while ((uVar11 + 7 & 0xfffffff8) != uVar16);
          }
          piVar5 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          if (piStack_1b8 != (int *)0x0) {
            LOCK();
            *piStack_1b8 = *piStack_1b8 + -1;
            UNLOCK();
            if (*piStack_1b8 == 0) {
              if (local_1a0 == (Allocator *)0x0) {
                if (local_1c0 != (Allocator *)0x0) {
                  free(local_1c0);
                }
              }
              else {
                (*local_1a0->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1b8 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          local_1c0 = (Allocator *)local_348.data;
          local_1b0 = local_348.elemsize;
          local_1a8 = local_348.elempack;
          local_1a0 = local_348.allocator;
          local_198 = CONCAT44(local_348.w,local_348.dims);
          sStack_190._0_4_ = local_348.h;
          sStack_190._4_4_ = local_348.d;
          local_188 = local_348.c;
          local_180 = local_348.cstep;
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
          local_2e8 = *(size_t *)(&this->field_0x250 + (long)p_Var13);
          local_2f8 = (Allocator *)
                      (local_2e8 * lVar19 + *(long *)(&this->field_0x240 + (long)p_Var13));
          local_2e0 = *(uint *)(&this->field_0x258 + (long)p_Var13);
          local_2d8 = *(Allocator **)(&this->field_0x260 + (long)p_Var13);
          local_2f0 = (int *)0x0;
          local_2d0 = local_98._0_8_;
          sStack_2c8 = local_98._8_8_;
          local_2c0 = 1;
          local_2b8 = 1;
          if (piStack_170 != (int *)0x0) {
            LOCK();
            *piStack_170 = *piStack_170 + -1;
            UNLOCK();
            if (*piStack_170 == 0) {
              if (local_158 == (Allocator *)0x0) {
                if (local_178 != (Allocator *)0x0) {
                  free(local_178);
                }
              }
              else {
                (*local_158->_vptr_Allocator[3])();
              }
            }
          }
          local_178 = local_2f8;
          piStack_170 = local_2f0;
          local_168 = local_2e8;
          local_160 = local_2e0;
          local_158 = local_2d8;
          local_150 = local_2d0;
          sStack_148 = sStack_2c8;
          local_140 = local_2c0;
          local_138 = local_2b8;
          if (local_2f0 != (int *)0x0) {
            LOCK();
            *local_2f0 = *local_2f0 + -1;
            UNLOCK();
            if (*local_2f0 == 0) {
              if (local_2d8 == (Allocator *)0x0) {
                if (local_2f8 != (Allocator *)0x0) {
                  free(local_2f8);
                }
              }
              else {
                (*local_2d8->_vptr_Allocator[3])();
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_348.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_348.data != (Allocator *)0x0) {
                  free(local_348.data);
                }
              }
              else {
                (*(local_348.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          auVar21 = local_98;
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
          if (100 < *(int *)(&this->field_0x10c + (long)p_Var13)) {
            local_348.elemsize = *(size_t *)(&this->field_0x298 + (long)p_Var13);
            local_348.data =
                 (void *)(local_348.elemsize * lVar19 +
                         *(long *)(&this->field_0x288 + (long)p_Var13));
            local_348.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var13);
            local_348.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var13);
            local_348.refcount._0_4_ = 0;
            local_348.refcount._4_4_ = 0;
            local_348.dims = local_98._0_4_;
            local_348.w = local_98._4_4_;
            local_348.h = local_98._8_4_;
            local_348.d = local_98._12_4_;
            local_348.c = 1;
            local_348.cstep = 1;
            local_98 = auVar21;
            if (piStack_128 != (int *)0x0) {
              LOCK();
              *piStack_128 = *piStack_128 + -1;
              UNLOCK();
              if (*piStack_128 == 0) {
                if (local_110 == (Allocator *)0x0) {
                  if (local_130 != (Allocator *)0x0) {
                    free(local_130);
                  }
                }
                else {
                  (*local_110->_vptr_Allocator[3])();
                }
              }
            }
            piVar5 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
            local_130 = (Allocator *)local_348.data;
            piStack_128 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
            sStack_120 = local_348.elemsize;
            uStack_118 = local_348.elempack;
            local_110 = local_348.allocator;
            local_108 = CONCAT44(local_348.w,local_348.dims);
            sStack_100._0_4_ = local_348.h;
            sStack_100._4_4_ = local_348.d;
            local_f8 = local_348.c;
            local_f0 = local_348.cstep;
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_348.allocator == (Allocator *)0x0) {
                  if ((Allocator *)local_348.data != (Allocator *)0x0) {
                    free(local_348.data);
                  }
                }
                else {
                  (*(local_348.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
        }
        in_ZMM7 = ZEXT1664(auVar22);
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_348,&local_208);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_348);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_348);
        lVar15 = 0xd8;
        do {
          piVar5 = *(int **)((long)&local_208.refcount + lVar15);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar6 = *(void **)((long)&local_208.data + lVar15);
              plVar7 = *(long **)((long)&local_208.allocator + lVar15);
              if (plVar7 == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_208.cstep + lVar15) = 0;
          *(undefined8 *)((long)&local_208.refcount + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_208.elemsize + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_208.data + lVar15) = 0;
          *(undefined8 *)((long)&local_208.refcount + lVar15) = 0;
          *(undefined8 *)((long)&local_208.dims + lVar15) = 0;
          *(undefined8 *)((long)&local_208.h + lVar15) = 0;
          *(undefined4 *)((long)&local_208.c + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      else {
        lVar15 = 0x40;
        auVar21._0_12_ = ZEXT812(0);
        auVar21._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_208.data + lVar15) = 0;
          *(undefined1 (*) [16])((long)&local_248 + lVar15) = auVar21;
          *(undefined1 (*) [16])(auStack_23c + lVar15) = auVar21;
          *(undefined1 (*) [16])((long)&uStack_228 + lVar15) = auVar21;
          *(undefined1 (*) [16])(auStack_21c + lVar15) = auVar21;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x1a8);
        if (local_208.refcount != (int *)0x0) {
          LOCK();
          *local_208.refcount = *local_208.refcount + -1;
          UNLOCK();
          if (*local_208.refcount == 0) {
            if (local_208.allocator == (Allocator *)0x0) {
              if (local_208.data != (void *)0x0) {
                free(local_208.data);
              }
            }
            else {
              (*(local_208.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_208.data = local_2a8;
        local_208.refcount = piStack_2a0;
        local_208.elemsize = local_298;
        local_208.elempack = local_290;
        local_208.allocator = local_288;
        local_208.w = iStack_27c;
        local_208.dims = local_280;
        local_208.h = (int)uStack_278;
        local_208.d = uStack_278._4_4_;
        local_208.c = local_270;
        local_208.cstep = local_268;
        piVar5 = (int *)CONCAT44(uStack_24c,uStack_250);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        if (piStack_1b8 != (int *)0x0) {
          LOCK();
          *piStack_1b8 = *piStack_1b8 + -1;
          UNLOCK();
          if (*piStack_1b8 == 0) {
            if (local_1a0 == (Allocator *)0x0) {
              if (local_1c0 != (Allocator *)0x0) {
                free(local_1c0);
              }
            }
            else {
              (*local_1a0->_vptr_Allocator[3])();
            }
          }
        }
        auVar22 = auVar30._0_16_;
        piStack_1b8 = (int *)CONCAT44(uStack_24c,uStack_250);
        local_1c0 = local_258;
        local_1b0 = CONCAT44(uStack_244,local_248);
        local_1a8 = local_240;
        local_1a0 = local_238;
        local_198 = CONCAT44(iStack_22c,uStack_230);
        sStack_190 = CONCAT44(uStack_224,uStack_228);
        local_188 = uStack_220;
        local_180 = local_218;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) != 0)
        {
          local_348.cstep = 0;
          local_348.data = (Allocator *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize = 0;
          local_348.elempack = 0;
          local_348.allocator = (Allocator *)local_348.data;
          local_348.dims = (int)local_348.refcount;
          local_348.w = local_348.elempack;
          local_348._48_8_ = local_348.elemsize;
          local_348.c = local_348.elempack;
          Mat::create(&local_348,i,4,(Allocator *)0x0);
          uVar11 = local_348.c * (int)local_348.cstep;
          auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar10._8_8_ = uStack_50;
          auVar10._0_8_ = local_58;
          auVar10._16_8_ = uStack_48;
          auVar10._24_8_ = uStack_40;
          auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
          auVar22 = auVar30._0_16_;
          if (0 < (int)uVar11) {
            lVar15 = (ulong)uVar11 - 1;
            auVar25._8_8_ = lVar15;
            auVar25._0_8_ = lVar15;
            auVar25._16_8_ = lVar15;
            auVar25._24_8_ = lVar15;
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) + lVar19 * 4);
            auVar23._4_4_ = uVar1;
            auVar23._0_4_ = uVar1;
            auVar23._8_4_ = uVar1;
            auVar23._12_4_ = uVar1;
            auVar23._16_4_ = uVar1;
            auVar23._20_4_ = uVar1;
            auVar23._24_4_ = uVar1;
            auVar23._28_4_ = uVar1;
            uVar16 = 0;
            do {
              auVar27._8_8_ = uVar16;
              auVar27._0_8_ = uVar16;
              auVar27._16_8_ = uVar16;
              auVar27._24_8_ = uVar16;
              auVar24 = vpor_avx2(auVar27,auVar8);
              auVar28 = vpor_avx2(auVar27,auVar9);
              auVar28 = vpcmpgtq_avx2(auVar28 ^ auVar10,auVar25 ^ auVar10);
              auVar24 = vpcmpgtq_avx2(auVar24 ^ auVar10,auVar25 ^ auVar10);
              auVar28 = vpackssdw_avx2(auVar24,auVar28);
              auVar21 = vpackssdw_avx(SUB3216(auVar28 ^ auVar30,0),SUB3216(auVar28 ^ auVar30,0x10));
              auVar21 = vpshufd_avx(auVar21,0xd8);
              auVar28 = vpmovzxwd_avx2(auVar21);
              auVar28 = vpslld_avx2(auVar28,0x1f);
              auVar28 = vmaskmovps_avx(auVar28,auVar23);
              *(undefined1 (*) [32])((long)(_func_int ***)local_348.data + uVar16 * 4) = auVar28;
              uVar16 = uVar16 + 8;
            } while ((uVar11 + 7 & 0xfffffff8) != uVar16);
          }
          piVar5 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          if (piStack_170 != (int *)0x0) {
            LOCK();
            *piStack_170 = *piStack_170 + -1;
            UNLOCK();
            if (*piStack_170 == 0) {
              if (local_158 == (Allocator *)0x0) {
                if (local_178 != (Allocator *)0x0) {
                  free(local_178);
                }
              }
              else {
                (*local_158->_vptr_Allocator[3])();
              }
            }
          }
          piStack_170 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          local_178 = (Allocator *)local_348.data;
          local_168 = local_348.elemsize;
          local_160 = local_348.elempack;
          local_158 = local_348.allocator;
          local_150 = CONCAT44(local_348.w,local_348.dims);
          sStack_148._0_4_ = local_348.h;
          sStack_148._4_4_ = local_348.d;
          local_140 = local_348.c;
          local_138 = local_348.cstep;
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
          local_2e8 = *(size_t *)(&this->field_0x250 + (long)p_Var13);
          local_2f8 = (Allocator *)
                      (local_2e8 * lVar19 + *(long *)(&this->field_0x240 + (long)p_Var13));
          local_2e0 = *(uint *)(&this->field_0x258 + (long)p_Var13);
          local_2d8 = *(Allocator **)(&this->field_0x260 + (long)p_Var13);
          local_2f0 = (int *)0x0;
          local_2d0 = local_98._0_8_;
          sStack_2c8 = local_98._8_8_;
          local_2c0 = 1;
          local_2b8 = 1;
          if (piStack_128 != (int *)0x0) {
            LOCK();
            *piStack_128 = *piStack_128 + -1;
            UNLOCK();
            if (*piStack_128 == 0) {
              if (local_110 == (Allocator *)0x0) {
                if (local_130 != (Allocator *)0x0) {
                  free(local_130);
                }
              }
              else {
                (*local_110->_vptr_Allocator[3])();
              }
            }
          }
          local_130 = local_2f8;
          piStack_128 = local_2f0;
          sStack_120 = local_2e8;
          uStack_118 = local_2e0;
          local_110 = local_2d8;
          local_108 = local_2d0;
          sStack_100 = sStack_2c8;
          local_f8 = local_2c0;
          local_f0 = local_2b8;
          if (local_2f0 != (int *)0x0) {
            LOCK();
            *local_2f0 = *local_2f0 + -1;
            UNLOCK();
            if (*local_2f0 == 0) {
              if (local_2d8 == (Allocator *)0x0) {
                if (local_2f8 != (Allocator *)0x0) {
                  free(local_2f8);
                }
              }
              else {
                (*local_2d8->_vptr_Allocator[3])();
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_348.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_348.data != (Allocator *)0x0) {
                  free(local_348.data);
                }
              }
              else {
                (*(local_348.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          auVar21 = local_98;
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
          if (100 < *(int *)(&this->field_0x10c + (long)p_Var13)) {
            local_348.elemsize = *(size_t *)(&this->field_0x298 + (long)p_Var13);
            local_348.data =
                 (void *)(local_348.elemsize * lVar19 +
                         *(long *)(&this->field_0x288 + (long)p_Var13));
            local_348.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var13);
            local_348.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var13);
            local_348.refcount._0_4_ = 0;
            local_348.refcount._4_4_ = 0;
            local_348.dims = local_98._0_4_;
            local_348.w = local_98._4_4_;
            local_348.h = local_98._8_4_;
            local_348.d = local_98._12_4_;
            local_348.c = 1;
            local_348.cstep = 1;
            local_98 = auVar21;
            if (piStack_e0 != (int *)0x0) {
              LOCK();
              *piStack_e0 = *piStack_e0 + -1;
              UNLOCK();
              if (*piStack_e0 == 0) {
                if (local_c8 == (Allocator *)0x0) {
                  if (local_e8 != (Allocator *)0x0) {
                    free(local_e8);
                  }
                }
                else {
                  (*local_c8->_vptr_Allocator[3])();
                }
              }
            }
            piVar5 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
            local_e8 = (Allocator *)local_348.data;
            piStack_e0 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
            sStack_d8 = local_348.elemsize;
            uStack_d0 = local_348.elempack;
            local_c8 = local_348.allocator;
            local_c0 = CONCAT44(local_348.w,local_348.dims);
            sStack_b8._0_4_ = local_348.h;
            sStack_b8._4_4_ = local_348.d;
            local_b0 = local_348.c;
            local_a8 = local_348.cstep;
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_348.allocator == (Allocator *)0x0) {
                  if ((Allocator *)local_348.data != (Allocator *)0x0) {
                    free(local_348.data);
                  }
                }
                else {
                  (*(local_348.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
        }
        in_ZMM7 = ZEXT1664(auVar22);
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_348,&local_208);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_348);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_348);
        lVar15 = 0x120;
        do {
          piVar5 = *(int **)((long)&local_208.refcount + lVar15);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar6 = *(void **)((long)&local_208.data + lVar15);
              plVar7 = *(long **)((long)&local_208.allocator + lVar15);
              if (plVar7 == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_208.cstep + lVar15) = 0;
          *(undefined8 *)((long)&local_208.refcount + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_208.elemsize + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_208.data + lVar15) = 0;
          *(undefined8 *)((long)&local_208.refcount + lVar15) = 0;
          *(undefined8 *)((long)&local_208.dims + lVar15) = 0;
          *(undefined8 *)((long)&local_208.h + lVar15) = 0;
          *(undefined4 *)((long)&local_208.c + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      (*pLVar14->_vptr_Layer[4])(pLVar14,local_70);
      (local_260->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar19] = pLVar14;
      ParamDict::~ParamDict(&local_68);
      piVar5 = (int *)CONCAT44(uStack_24c,uStack_250);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_238 == (Allocator *)0x0) {
            if (local_258 != (Allocator *)0x0) {
              free(local_258);
            }
          }
          else {
            (*local_238->_vptr_Allocator[3])();
          }
        }
      }
      if (piStack_2a0 != (int *)0x0) {
        LOCK();
        *piStack_2a0 = *piStack_2a0 + -1;
        UNLOCK();
        if (*piStack_2a0 == 0) {
          if (local_288 == (Allocator *)0x0) {
            if (local_2a8 != (void *)0x0) {
              free(local_2a8);
            }
          }
          else {
            (*local_288->_vptr_Allocator[3])();
          }
        }
      }
      lVar19 = lVar19 + 1;
      p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
    } while (lVar19 < *(int *)(&this->field_0x108 + (long)p_Var13));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}